

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# in_clause_simplification_rule.cpp
# Opt level: O2

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::InClauseSimplificationRule::Apply
          (InClauseSimplificationRule *this,LogicalOperator *op,
          vector<std::reference_wrapper<duckdb::Expression>,_true> *bindings,bool *changes_made,
          bool is_root)

{
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *this_00;
  _Head_base<0UL,_duckdb::BoundConstantExpression_*,_false> _Var1;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var2;
  bool bVar3;
  reference pvVar4;
  BoundOperatorExpression *pBVar5;
  reference pvVar6;
  pointer pEVar7;
  BoundCastExpression *this_01;
  ClientContext *context;
  type expr;
  pointer puVar8;
  reference pvVar9;
  __uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_> *this_02;
  pointer puVar10;
  ulong uVar11;
  _func_int **local_c8;
  long *local_c0;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *local_b8;
  LogicalOperator *local_b0;
  vector<duckdb::unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>,_true>
  cast_list;
  LogicalType target_type;
  Value constant_value;
  
  local_b0 = op;
  pvVar4 = vector<std::reference_wrapper<duckdb::Expression>,_true>::get<true>
                     ((vector<std::reference_wrapper<duckdb::Expression>,_true> *)changes_made,0);
  pBVar5 = BaseExpression::Cast<duckdb::BoundOperatorExpression>
                     (&pvVar4->_M_data->super_BaseExpression);
  this_00 = &pBVar5->children;
  pvVar6 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::get<true>(this_00,0);
  pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar6);
  if ((pEVar7->super_BaseExpression).expression_class == BOUND_CAST) {
    pvVar6 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::get<true>(this_00,0);
    pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar6);
    this_01 = BaseExpression::Cast<duckdb::BoundCastExpression>(&pEVar7->super_BaseExpression);
    pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(&this_01->child);
    if ((pEVar7->super_BaseExpression).expression_class == BOUND_COLUMN_REF) {
      local_b8 = &this_01->child;
      BoundCastExpression::source_type(&target_type,this_01);
      bVar3 = BoundCastExpression::CastIsInvertible
                        (&target_type,&(this_01->super_Expression).return_type);
      if (bVar3) {
        cast_list.
        super_vector<duckdb::unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        cast_list.
        super_vector<duckdb::unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        cast_list.
        super_vector<duckdb::unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_c8 = (this->super_Rule)._vptr_Rule;
        uVar11 = 1;
LAB_0058ac01:
        puVar10 = (pBVar5->children).
                  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        puVar8 = (pBVar5->children).
                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if ((ulong)((long)puVar8 - (long)puVar10 >> 3) <= uVar11) {
          (this->super_Rule)._vptr_Rule = local_c8;
          for (uVar11 = 1; uVar11 < (ulong)((long)puVar8 - (long)puVar10 >> 3); uVar11 = uVar11 + 1)
          {
            pvVar9 = vector<duckdb::unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>,_true>
                     ::get<true>(&cast_list,uVar11 - 1);
            _Var1._M_head_impl =
                 (pvVar9->
                 super_unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>_>
                 )._M_t.
                 super___uniq_ptr_impl<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::BoundConstantExpression_*,_std::default_delete<duckdb::BoundConstantExpression>_>
                 .super__Head_base<0UL,_duckdb::BoundConstantExpression_*,_false>._M_head_impl;
            (pvVar9->
            super_unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>_>
            )._M_t.
            super___uniq_ptr_impl<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::BoundConstantExpression_*,_std::default_delete<duckdb::BoundConstantExpression>_>
            .super__Head_base<0UL,_duckdb::BoundConstantExpression_*,_false>._M_head_impl =
                 (BoundConstantExpression *)0x0;
            pvVar6 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                     ::get<true>(this_00,uVar11);
            _Var2._M_head_impl =
                 (pvVar6->
                 super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
                 _M_t.
                 super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                 .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
            (pvVar6->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
            ._M_t.
            super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
            .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
            super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
                 &(_Var1._M_head_impl)->super_Expression;
            if (_Var2._M_head_impl != (Expression *)0x0) {
              (**(code **)(*(long *)&(_Var2._M_head_impl)->super_BaseExpression + 8))();
            }
            puVar10 = (pBVar5->children).
                      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                      .
                      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            puVar8 = (pBVar5->children).
                     super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     .
                     super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          }
          this_02 = (__uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_> *
                    )vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                     ::get<true>(this_00,0);
          ::std::__uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>::
          operator=(this_02,(__uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                             *)local_b8);
LAB_0058ad88:
          (this->super_Rule)._vptr_Rule = (_func_int **)0x0;
          goto LAB_0058ada6;
        }
        pvVar6 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                 ::get<true>(this_00,uVar11);
        pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(pvVar6);
        if ((pEVar7->super_BaseExpression).expression_class != BOUND_CONSTANT) goto LAB_0058ad88;
        context = Rule::GetContext((Rule *)local_b0);
        pvVar6 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                 ::get<true>(this_00,uVar11);
        expr = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator*(pvVar6);
        ExpressionExecutor::EvaluateScalar(&constant_value,context,expr,false);
        bVar3 = BoundCastExpression::CastIsInvertible(&constant_value.type_,&target_type);
        if (bVar3) goto LAB_0058ac7e;
        (this->super_Rule)._vptr_Rule = (_func_int **)0x0;
        Value::~Value(&constant_value);
        goto LAB_0058ada6;
      }
      (this->super_Rule)._vptr_Rule = (_func_int **)0x0;
      goto LAB_0058adb0;
    }
  }
  (this->super_Rule)._vptr_Rule = (_func_int **)0x0;
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>)this;
LAB_0058ac7e:
  bVar3 = Value::DefaultTryCastAs(&constant_value,&target_type,false);
  if (bVar3) {
    make_uniq<duckdb::BoundConstantExpression,duckdb::Value&>((duckdb *)&local_c0,&constant_value);
    ::std::
    vector<duckdb::unique_ptr<duckdb::BoundConstantExpression,std::default_delete<duckdb::BoundConstantExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::BoundConstantExpression,std::default_delete<duckdb::BoundConstantExpression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::BoundConstantExpression,std::default_delete<duckdb::BoundConstantExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::BoundConstantExpression,std::default_delete<duckdb::BoundConstantExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::BoundConstantExpression,std::default_delete<duckdb::BoundConstantExpression>,true>>>
                *)&cast_list,
               (unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>
                *)&local_c0);
    if (local_c0 != (long *)0x0) {
      (**(code **)(*local_c0 + 8))();
    }
  }
  else {
    local_c8 = (_func_int **)0x0;
  }
  Value::~Value(&constant_value);
  uVar11 = uVar11 + 1;
  if (!bVar3) goto code_r0x0058ace0;
  goto LAB_0058ac01;
code_r0x0058ace0:
  (this->super_Rule)._vptr_Rule = local_c8;
LAB_0058ada6:
  ::std::
  vector<duckdb::unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>_>_>
  ::~vector(&cast_list.
             super_vector<duckdb::unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>_>_>
           );
LAB_0058adb0:
  LogicalType::~LogicalType(&target_type);
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> InClauseSimplificationRule::Apply(LogicalOperator &op, vector<reference<Expression>> &bindings,
                                                         bool &changes_made, bool is_root) {
	auto &expr = bindings[0].get().Cast<BoundOperatorExpression>();
	if (expr.children[0]->GetExpressionClass() != ExpressionClass::BOUND_CAST) {
		return nullptr;
	}
	auto &cast_expression = expr.children[0]->Cast<BoundCastExpression>();
	if (cast_expression.child->GetExpressionClass() != ExpressionClass::BOUND_COLUMN_REF) {
		return nullptr;
	}
	//! The goal here is to remove the cast from the probe expression
	//! and apply a cast to the constant expressions. We can only do this
	//! if the semantics do not change, which only happens when BOTH casts
	//! are invertible.
	auto target_type = cast_expression.source_type();
	if (!BoundCastExpression::CastIsInvertible(target_type, cast_expression.return_type)) {
		return nullptr;
	}
	vector<unique_ptr<BoundConstantExpression>> cast_list;
	//! First check if we can cast all children
	for (size_t i = 1; i < expr.children.size(); i++) {
		if (expr.children[i]->GetExpressionClass() != ExpressionClass::BOUND_CONSTANT) {
			return nullptr;
		}
		D_ASSERT(expr.children[i]->IsFoldable());
		auto constant_value = ExpressionExecutor::EvaluateScalar(GetContext(), *expr.children[i]);
		if (!BoundCastExpression::CastIsInvertible(constant_value.type(), target_type)) {
			return nullptr;
		}
		auto new_constant = constant_value.DefaultTryCastAs(target_type);
		if (!new_constant) {
			return nullptr;
		} else {
			auto new_constant_expr = make_uniq<BoundConstantExpression>(constant_value);
			cast_list.push_back(std::move(new_constant_expr));
		}
	}
	//! We can cast, so we move the new constant
	for (size_t i = 1; i < expr.children.size(); i++) {
		expr.children[i] = std::move(cast_list[i - 1]);

		//		expr->children[i] = std::move(new_constant_expr);
	}
	//! We can cast the full list, so we move the column
	expr.children[0] = std::move(cast_expression.child);
	return nullptr;
}